

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_logger.h
# Opt level: O3

void __thiscall leveldb::PosixLogger::Logv(PosixLogger *this,char *format,__va_list_tag *arguments)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pthread_t pVar5;
  char *__s;
  int iVar6;
  size_t __maxlen;
  va_list arguments_copy;
  string thread_id;
  tm now_components;
  time_t now_seconds;
  timeval now_timeval;
  ostringstream thread_stream;
  ios_base local_340 [264];
  char stack_buffer [512];
  
  gettimeofday((timeval *)&now_timeval,(__timezone_ptr_t)0x0);
  now_seconds = now_timeval.tv_sec;
  localtime_r(&now_seconds,(tm *)&now_components);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&thread_stream);
  pVar5 = pthread_self();
  if (pVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&thread_stream,"thread::id of a non-executing thread",0x24);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)&thread_stream);
  }
  std::__cxx11::stringbuf::str();
  if (0x20 < thread_id._M_string_length) {
    std::__cxx11::string::resize((ulong)&thread_id,' ');
  }
  bVar1 = true;
  uVar4 = 0;
  while( true ) {
    __maxlen = (size_t)uVar4;
    __s = stack_buffer;
    if (bVar1) {
      __maxlen = 0x200;
    }
    else {
      __s = (char *)operator_new__((ulong)uVar4);
    }
    iVar6 = (int)__maxlen;
    iVar2 = snprintf(__s,__maxlen,"%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
                     (ulong)(now_components.tm_year + 0x76c),(ulong)(now_components.tm_mon + 1),
                     (ulong)(uint)now_components.tm_mday,(ulong)(uint)now_components.tm_hour,
                     (ulong)(uint)now_components.tm_min,(ulong)(uint)now_components.tm_sec,
                     (ulong)(uint)now_timeval.tv_usec,thread_id._M_dataplus._M_p);
    if (0x3c < iVar2) {
      __assert_fail("buffer_offset <= 28 + kMaxThreadIdSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x4b,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    if (iVar6 - iVar2 == 0 || iVar6 < iVar2) {
      __assert_fail("buffer_offset < buffer_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x4e,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    arguments_copy[0].reg_save_area = arguments->reg_save_area;
    arguments_copy[0].gp_offset = arguments->gp_offset;
    arguments_copy[0].fp_offset = arguments->fp_offset;
    arguments_copy[0].overflow_arg_area = arguments->overflow_arg_area;
    iVar3 = vsnprintf(__s + iVar2,(long)(iVar6 - iVar2),format,arguments_copy);
    iVar3 = iVar3 + iVar2;
    if (iVar3 < iVar6 + -1) break;
    if (!bVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                    ,0x67,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
    }
    uVar4 = iVar3 + 2;
    bVar1 = false;
  }
  if (__s[(long)iVar3 + -1] != '\n') {
    __s[iVar3] = '\n';
    iVar3 = iVar3 + 1;
  }
  if (iVar6 < iVar3) {
    __assert_fail("buffer_offset <= buffer_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./util/posix_logger.h"
                  ,0x71,"virtual void leveldb::PosixLogger::Logv(const char *, __va_list_tag *)");
  }
  fwrite(__s,1,(long)iVar3,(FILE *)this->fp_);
  fflush((FILE *)this->fp_);
  if (!bVar1) {
    operator_delete__(__s);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thread_id._M_dataplus._M_p != &thread_id.field_2) {
    operator_delete(thread_id._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&thread_stream);
  std::ios_base::~ios_base(local_340);
  return;
}

Assistant:

void Logv(const char* format, std::va_list arguments) override {
    // Record the time as close to the Logv() call as possible.
    struct ::timeval now_timeval;
    ::gettimeofday(&now_timeval, nullptr);
    const std::time_t now_seconds = now_timeval.tv_sec;
    struct std::tm now_components;
    ::localtime_r(&now_seconds, &now_components);

    // Record the thread ID.
    constexpr const int kMaxThreadIdSize = 32;
    std::ostringstream thread_stream;
    thread_stream << std::this_thread::get_id();
    std::string thread_id = thread_stream.str();
    if (thread_id.size() > kMaxThreadIdSize) {
      thread_id.resize(kMaxThreadIdSize);
    }

    // We first attempt to print into a stack-allocated buffer. If this attempt
    // fails, we make a second attempt with a dynamically allocated buffer.
    constexpr const int kStackBufferSize = 512;
    char stack_buffer[kStackBufferSize];
    static_assert(sizeof(stack_buffer) == static_cast<size_t>(kStackBufferSize),
                  "sizeof(char) is expected to be 1 in C++");

    int dynamic_buffer_size = 0;  // Computed in the first iteration.
    for (int iteration = 0; iteration < 2; ++iteration) {
      const int buffer_size =
          (iteration == 0) ? kStackBufferSize : dynamic_buffer_size;
      char* const buffer =
          (iteration == 0) ? stack_buffer : new char[dynamic_buffer_size];

      // Print the header into the buffer.
      int buffer_offset = std::snprintf(
          buffer, buffer_size, "%04d/%02d/%02d-%02d:%02d:%02d.%06d %s ",
          now_components.tm_year + 1900, now_components.tm_mon + 1,
          now_components.tm_mday, now_components.tm_hour, now_components.tm_min,
          now_components.tm_sec, static_cast<int>(now_timeval.tv_usec),
          thread_id.c_str());

      // The header can be at most 28 characters (10 date + 15 time +
      // 3 delimiters) plus the thread ID, which should fit comfortably into the
      // static buffer.
      assert(buffer_offset <= 28 + kMaxThreadIdSize);
      static_assert(28 + kMaxThreadIdSize < kStackBufferSize,
                    "stack-allocated buffer may not fit the message header");
      assert(buffer_offset < buffer_size);

      // Print the message into the buffer.
      std::va_list arguments_copy;
      va_copy(arguments_copy, arguments);
      buffer_offset +=
          std::vsnprintf(buffer + buffer_offset, buffer_size - buffer_offset,
                         format, arguments_copy);
      va_end(arguments_copy);

      // The code below may append a newline at the end of the buffer, which
      // requires an extra character.
      if (buffer_offset >= buffer_size - 1) {
        // The message did not fit into the buffer.
        if (iteration == 0) {
          // Re-run the loop and use a dynamically-allocated buffer. The buffer
          // will be large enough for the log message, an extra newline and a
          // null terminator.
          dynamic_buffer_size = buffer_offset + 2;
          continue;
        }

        // The dynamically-allocated buffer was incorrectly sized. This should
        // not happen, assuming a correct implementation of std::(v)snprintf.
        // Fail in tests, recover by truncating the log message in production.
        assert(false);
        buffer_offset = buffer_size - 1;
      }

      // Add a newline if necessary.
      if (buffer[buffer_offset - 1] != '\n') {
        buffer[buffer_offset] = '\n';
        ++buffer_offset;
      }

      assert(buffer_offset <= buffer_size);
      std::fwrite(buffer, 1, buffer_offset, fp_);
      std::fflush(fp_);

      if (iteration != 0) {
        delete[] buffer;
      }
      break;
    }
  }